

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode.c
# Opt level: O0

char * upb_EncodeStatus_String(upb_EncodeStatus status)

{
  char *pcStack_10;
  upb_EncodeStatus status_local;
  
  switch(status) {
  case kUpb_EncodeStatus_Ok:
    pcStack_10 = "Ok";
    break;
  case kUpb_EncodeStatus_OutOfMemory:
    pcStack_10 = "Arena alloc failed";
    break;
  case kUpb_EncodeStatus_MaxDepthExceeded:
    pcStack_10 = "Max depth exceeded";
    break;
  case kUpb_EncodeStatus_MissingRequired:
    pcStack_10 = "Missing required field";
    break;
  default:
    pcStack_10 = "Unknown encode status";
  }
  return pcStack_10;
}

Assistant:

const char* upb_EncodeStatus_String(upb_EncodeStatus status) {
  switch (status) {
    case kUpb_EncodeStatus_Ok:
      return "Ok";
    case kUpb_EncodeStatus_MissingRequired:
      return "Missing required field";
    case kUpb_EncodeStatus_MaxDepthExceeded:
      return "Max depth exceeded";
    case kUpb_EncodeStatus_OutOfMemory:
      return "Arena alloc failed";
    default:
      return "Unknown encode status";
  }
}